

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.cpp
# Opt level: O0

CaseResult * rc::detail::toCaseResult(CaseResult *__return_storage_ptr__,bool value)

{
  allocator local_71;
  string local_70;
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38;
  undefined1 local_11;
  CaseResult *pCStack_10;
  bool value_local;
  
  local_3a = 0;
  local_4d = 0;
  local_11 = value;
  pCStack_10 = __return_storage_ptr__;
  if (value) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string((string *)&local_38,"Returned true",&local_39);
    local_4d = 1;
    CaseResult::CaseResult(__return_storage_ptr__,Success,&local_38);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_70,"Returned false",&local_71);
    CaseResult::CaseResult(__return_storage_ptr__,Failure,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return __return_storage_ptr__;
}

Assistant:

CaseResult toCaseResult(bool value) {
  return value ? CaseResult(CaseResult::Type::Success, "Returned true")
               : CaseResult(CaseResult::Type::Failure, "Returned false");
}